

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.cpp
# Opt level: O1

bool parseICrashStrategy(string *strategy,ICrashStrategy *icrash_strategy)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  ICrashStrategy IVar4;
  bool bVar5;
  size_type sVar6;
  string lower;
  string local_48;
  
  pcVar1 = (strategy->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + strategy->_M_string_length);
  trim(&local_48,&default_non_chars_abi_cxx11_);
  _Var2._M_p = local_48._M_dataplus._M_p;
  if (local_48._M_string_length != 0) {
    sVar6 = 0;
    do {
      iVar3 = tolower((uint)(byte)_Var2._M_p[sVar6]);
      _Var2._M_p[sVar6] = (char)iVar3;
      sVar6 = sVar6 + 1;
    } while (local_48._M_string_length != sVar6);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar3 == 0) {
    IVar4 = kPenalty;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar3 == 0) {
      IVar4 = kAdmm;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_48);
      if (iVar3 == 0) {
        IVar4 = kICA;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_48);
        if (iVar3 == 0) {
          IVar4 = kUpdatePenalty;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_48);
          if (iVar3 != 0) {
            bVar5 = false;
            goto LAB_0033084d;
          }
          IVar4 = kUpdateAdmm;
        }
      }
    }
  }
  *icrash_strategy = IVar4;
  bVar5 = true;
LAB_0033084d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return bVar5;
}

Assistant:

bool parseICrashStrategy(const std::string& strategy,
                         ICrashStrategy& icrash_strategy) {
  std::string lower = strategy;
  trim(lower);
  std::transform(lower.begin(), lower.end(), lower.begin(),
                 [](unsigned char c) { return std::tolower(c); });

  if (lower == "penalty")
    icrash_strategy = ICrashStrategy::kPenalty;
  else if (lower == "admm")
    icrash_strategy = ICrashStrategy::kAdmm;
  else if (lower == "ica")
    icrash_strategy = ICrashStrategy::kICA;
  else if (lower == "update_penalty")
    icrash_strategy = ICrashStrategy::kUpdatePenalty;
  else if (lower == "update_admm")
    icrash_strategy = ICrashStrategy::kUpdateAdmm;
  else
    return false;
  return true;
}